

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O2

Aig_Obj_t * Aig_ManFetchMemory(Aig_Man_t *p)

{
  Vec_Ptr_t *p_00;
  Aig_Obj_t *Entry;
  
  Entry = (Aig_Obj_t *)Aig_MmFixedEntryFetch(p->pMemObjs);
  (Entry->field_0).pNext = (Aig_Obj_t *)0x0;
  Entry->pFanin0 = (Aig_Obj_t *)0x0;
  Entry->pFanin1 = (Aig_Obj_t *)0x0;
  *(undefined8 *)&Entry->field_0x18 = 0;
  Entry->TravId = 0;
  Entry->Id = 0;
  (Entry->field_5).pData = (void *)0x0;
  p_00 = p->vObjs;
  Entry->Id = p_00->nSize;
  Vec_PtrPush(p_00,Entry);
  return Entry;
}

Assistant:

static inline Aig_Obj_t * Aig_ManFetchMemory( Aig_Man_t * p )  
{
    extern char * Aig_MmFixedEntryFetch( Aig_MmFixed_t * p );
    Aig_Obj_t * pTemp;
    pTemp = (Aig_Obj_t *)Aig_MmFixedEntryFetch( p->pMemObjs );
    memset( pTemp, 0, sizeof(Aig_Obj_t) ); 
    pTemp->Id = Vec_PtrSize(p->vObjs);
    Vec_PtrPush( p->vObjs, pTemp );
    return pTemp;
}